

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  iVar1 = pAig->vObjs->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  pVVar3 = pAig->vCis;
  if (pVVar3->nSize < 1) {
    uVar6 = 0;
  }
  else {
    ppvVar4 = pVVar3->pArray;
    uVar9 = 0;
    do {
      iVar7 = *(int *)((long)ppvVar4[uVar9] + 0x24);
      if (((long)iVar7 < 0) || (iVar1 <= iVar7)) goto LAB_0083b498;
      uVar6 = uVar9 + 1;
      __s[iVar7] = (int)uVar9;
      uVar9 = uVar6;
    } while ((long)uVar6 < (long)pVVar3->nSize);
  }
  lVar8 = (long)pAig->nRegs;
  if (0 < lVar8) {
    pVVar3 = pAig->vCos;
    iVar7 = pAig->nTruePos;
    lVar10 = (long)iVar7;
    do {
      if ((iVar7 < 0) || (pVVar3->nSize <= lVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar3->pArray[lVar10] + 0x24);
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_0083b498:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = (int)uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}